

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qzip.cpp
# Opt level: O1

QByteArray * __thiscall
QZipReader::fileData(QByteArray *__return_storage_ptr__,QZipReader *this,QString *fileName)

{
  uchar *puVar1;
  uchar *puVar2;
  FileHeader *pFVar3;
  long lVar4;
  FileHeader *pFVar5;
  QIODevice *pQVar6;
  Data *pDVar7;
  char *pcVar8;
  uint uVar9;
  undefined1 uVar10;
  undefined1 uVar12;
  uint uVar13;
  undefined1 uVar14;
  undefined1 uVar16;
  ulong uVar17;
  ulong uVar18;
  qsizetype qVar19;
  ushort uVar20;
  bool bVar21;
  int iVar22;
  int iVar23;
  QZipReaderPrivate *pQVar24;
  undefined4 extraout_var;
  char *pcVar25;
  uint uVar26;
  char16_t *in_RCX;
  QArrayData *__nbytes;
  __off_t __length;
  long lVar27;
  ulong uVar28;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QStringView rhs;
  QStringView lhs;
  FileHeader header;
  QByteArray local_168;
  QMessageLogger local_148;
  ulong local_128;
  ulong uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 *local_d8;
  ushort uStack_d0;
  undefined4 uStack_ce;
  undefined2 uStack_ca;
  undefined6 uStack_c8;
  undefined1 *puStack_c2;
  QString local_b8;
  uint uStack_a0;
  undefined2 uStack_9c;
  undefined2 uStack_9a;
  undefined2 local_98;
  undefined4 uStack_96;
  undefined2 uStack_92;
  undefined2 uStack_90;
  int iStack_8e;
  undefined2 uStack_8a;
  QArrayData *local_88;
  char *pcStack_80;
  qsizetype local_78;
  QArrayData *pQStack_70;
  char *local_68;
  qsizetype qStack_60;
  QArrayData *local_58;
  char *pcStack_50;
  qsizetype local_48;
  long local_38;
  undefined2 uVar11;
  undefined2 uVar15;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QZipReaderPrivate::scanFiles(this->d);
  pQVar24 = this->d;
  if ((pQVar24->super_QZipPrivate).fileHeaders.d.size == 0) {
    uVar28 = 0;
  }
  else {
    lVar27 = 0x40;
    uVar28 = 0;
    do {
      pFVar3 = (pQVar24->super_QZipPrivate).fileHeaders.d.ptr;
      ba.m_data = (storage_type *)in_RCX;
      ba.m_size = *(qsizetype *)((pFVar3->h).signature + lVar27 + -8);
      QString::fromLocal8Bit(&local_b8,*(QString **)((pFVar3->h).signature + lVar27),ba);
      lVar4 = (fileName->d).size;
      if (local_b8.d.size == lVar4) {
        in_RCX = (fileName->d).ptr;
        rhs.m_data = in_RCX;
        rhs.m_size = lVar4;
        lhs.m_data = local_b8.d.ptr;
        lhs.m_size = local_b8.d.size;
        bVar21 = QtPrivate::equalStrings(lhs,rhs);
      }
      else {
        bVar21 = false;
      }
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (bVar21 != false) break;
      uVar28 = uVar28 + 1;
      pQVar24 = this->d;
      lVar27 = lVar27 + 0x78;
    } while (uVar28 < (ulong)(pQVar24->super_QZipPrivate).fileHeaders.d.size);
  }
  if ((this->d->super_QZipPrivate).fileHeaders.d.size == uVar28) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
    goto LAB_0026e0d5;
  }
  uStack_8a = 0xaaaa;
  pFVar5 = (this->d->super_QZipPrivate).fileHeaders.d.ptr;
  pFVar3 = pFVar5 + uVar28;
  uVar10 = (pFVar3->h).version_needed[0];
  uVar12 = (pFVar3->h).version_needed[1];
  uVar11 = CONCAT11(uVar12,uVar10);
  local_b8.d.d = *(Data **)&pFVar3->h;
  uVar26._0_1_ = (pFVar3->h).general_purpose_bits[0];
  uVar26._1_1_ = (pFVar3->h).general_purpose_bits[1];
  uVar26._2_1_ = (pFVar3->h).compression_method[0];
  uVar26._3_1_ = (pFVar3->h).compression_method[1];
  local_b8.d.ptr = *(char16_t **)(pFVar3->h).general_purpose_bits;
  pFVar3 = pFVar5 + uVar28;
  puVar1 = (pFVar3->h).crc_32;
  uVar13 = *(uint *)(puVar1 + 4);
  local_b8.d.size._0_1_ = (pFVar3->h).crc_32[0];
  local_b8.d.size._1_1_ = (pFVar3->h).crc_32[1];
  local_b8.d.size._2_1_ = (pFVar3->h).crc_32[2];
  local_b8.d.size._3_1_ = (pFVar3->h).crc_32[3];
  local_b8.d.size._4_1_ = (pFVar3->h).compressed_size[0];
  local_b8.d.size._5_1_ = (pFVar3->h).compressed_size[1];
  local_b8.d.size._6_1_ = (pFVar3->h).compressed_size[2];
  local_b8.d.size._7_1_ = (pFVar3->h).compressed_size[3];
  uVar9 = *(uint *)(puVar1 + 8);
  pFVar3 = pFVar5 + uVar28;
  puVar2 = (pFVar3->h).extra_field_length;
  uVar14 = (pFVar3->h).file_comment_length[0];
  uVar16 = (pFVar3->h).file_comment_length[1];
  uVar15 = CONCAT11(uVar16,uVar14);
  uStack_96 = *(undefined4 *)(puVar2 + 4);
  iStack_8e = *(int *)(puVar2 + 0xc);
  uStack_92 = (undefined2)*(undefined4 *)(puVar2 + 8);
  uStack_90 = (undefined2)((uint)*(undefined4 *)(puVar2 + 8) >> 0x10);
  uStack_9c = (undefined2)*(undefined4 *)(puVar1 + 0xc);
  uStack_9a = (undefined2)((uint)*(undefined4 *)(puVar1 + 0xc) >> 0x10);
  local_88 = &(pFVar5[uVar28].file_name.d.d)->super_QArrayData;
  pcStack_80 = pFVar5[uVar28].file_name.d.ptr;
  local_78 = pFVar5[uVar28].file_name.d.size;
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&local_88->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&local_88->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pQStack_70 = &(pFVar5[uVar28].extra_field.d.d)->super_QArrayData;
  local_68 = pFVar5[uVar28].extra_field.d.ptr;
  qStack_60 = pFVar5[uVar28].extra_field.d.size;
  if (pQStack_70 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&pQStack_70->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&pQStack_70->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  __nbytes = &(pFVar5[uVar28].file_comment.d.d)->super_QArrayData;
  pcStack_50 = pFVar5[uVar28].file_comment.d.ptr;
  local_48 = pFVar5[uVar28].file_comment.d.size;
  if (__nbytes != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&__nbytes->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&__nbytes->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  uStack_a0 = uVar9;
  local_98 = uVar15;
  local_58 = __nbytes;
  if ((ushort)uVar11 < 0x15) {
    pQVar6 = (this->d->super_QZipPrivate).device;
    (*(pQVar6->super_QObject)._vptr_QObject[0x11])(pQVar6,(long)iStack_8e);
    uStack_c8 = 0xaaaaaaaaaaaa;
    puStack_c2 = &DAT_aaaaaaaaaaaaaaaa;
    local_d8 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_d0 = 0xaaaa;
    uStack_ce = 0xaaaaaaaa;
    uStack_ca = 0xaaaa;
    QIODevice::read((this->d->super_QZipPrivate).device,(int)&local_d8,(void *)0x1e,(size_t)__nbytes
                   );
    uVar28 = (ulong)puStack_c2 >> 0x20;
    uVar18 = (ulong)puStack_c2 >> 0x28;
    uVar17 = (ulong)puStack_c2 >> 0x30;
    pQVar6 = (this->d->super_QZipPrivate).device;
    iVar22 = (*(pQVar6->super_QObject)._vptr_QObject[0xf])(pQVar6);
    (*(pQVar6->super_QObject)._vptr_QObject[0x11])
              (pQVar6,(uVar18 & 0xff) * 0x100 + (uVar28 & 0xff) + uVar17 +
                      CONCAT44(extraout_var,iVar22));
    uVar20 = uStack_d0;
    if ((uVar26 & 1) != 0) {
      local_148.context.version = 2;
      local_148.context.line = 0;
      local_148.context.file._0_4_ = 0;
      local_148.context.file._4_4_ = 0;
      local_148.context.function._0_4_ = 0;
      local_148.context.function._4_4_ = 0;
      local_148.context.category = "default";
      QMessageLogger::warning
                (&local_148,"QZip: Unsupported encryption method is needed to extract the data.");
      goto LAB_0026e04c;
    }
    uVar26 = uVar13 & 0xffff | (uVar13 >> 0x10 & 0xff) << 0x10 | uVar13 & 0xff000000;
    uVar28 = (ulong)uStack_d0;
    local_168.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_168.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_168.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QIODevice::read((QIODevice *)&local_168,(int)(this->d->super_QZipPrivate).device,
                    (char *)(long)(int)uVar26,(ulong)uVar26);
    if (uVar20 == 8) {
      QByteArray::truncate(&local_168,(char *)(long)(int)uVar26,__length);
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char *)0x0;
      (__return_storage_ptr__->d).size = 0;
      if ((int)uVar9 < 2) {
        uVar9 = 1;
      }
      uVar28 = (ulong)uVar9;
      do {
        QByteArray::resize(__return_storage_ptr__,uVar28);
        pDVar7 = (__return_storage_ptr__->d).d;
        if ((pDVar7 == (Data *)0x0) ||
           (1 < (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QByteArray::reallocData(__return_storage_ptr__,(__return_storage_ptr__->d).size,KeepSize);
        }
        pcVar25 = local_168.d.ptr;
        if (local_168.d.ptr == (char *)0x0) {
          pcVar25 = "";
        }
        pcVar8 = (__return_storage_ptr__->d).ptr;
        local_148.context.file._4_4_ = 0;
        local_e8 = 0;
        uStack_e0 = 0;
        local_f8 = 0;
        uStack_f0 = 0;
        local_108 = 0;
        uStack_100 = 0;
        local_118 = 0;
        uStack_110 = 0;
        local_128 = 0;
        uStack_120 = 0;
        local_148.context.function._0_4_ = 0;
        local_148.context.function._4_4_ = 0;
        local_148.context.category = (char *)0x0;
        local_148.context.version = (int)pcVar25;
        local_148.context.line = (int)((ulong)pcVar25 >> 0x20);
        iVar22 = -5;
        local_148.context.file._0_4_ = uVar26;
        if (((-1 < (int)(uVar13 & 0xff000000)) &&
            (local_128 = uVar28 & 0xffffffff, local_148.context.category = pcVar8,
            uVar28 >> 0x20 == 0)) &&
           (iVar22 = inflateInit2_(&local_148,0xfffffff1,"1.2.11",0x70), iVar22 == 0)) {
          iVar23 = inflate(&local_148,4);
          uVar17 = uStack_120;
          if (iVar23 == 1) {
            iVar22 = inflateEnd(&local_148);
            uVar28 = uVar17;
          }
          else {
            inflateEnd(&local_148);
            iVar22 = -3;
            if ((iVar23 != 2) && (iVar22 = -3, iVar23 != -5 || (uint)local_148.context.file != 0)) {
              iVar22 = iVar23;
            }
          }
        }
        switch(iVar22) {
        case 0:
          if ((long)(int)uVar28 != (__return_storage_ptr__->d).size) {
            QByteArray::resize(__return_storage_ptr__,uVar28);
          }
          break;
        case -5:
          uVar28 = uVar28 * 2;
          break;
        case -4:
          local_148.context.version = 2;
          local_148.context.line = 0;
          local_148.context.file._0_4_ = 0;
          local_148.context.file._4_4_ = 0;
          local_148.context.function._0_4_ = 0;
          local_148.context.function._4_4_ = 0;
          local_148.context.category = "default";
          QMessageLogger::warning(&local_148,"QZip: Z_MEM_ERROR: Not enough memory");
          break;
        case -3:
          local_148.context.version = 2;
          local_148.context.line = 0;
          local_148.context.file._0_4_ = 0;
          local_148.context.file._4_4_ = 0;
          local_148.context.function._0_4_ = 0;
          local_148.context.function._4_4_ = 0;
          local_148.context.category = "default";
          QMessageLogger::warning(&local_148,"QZip: Z_DATA_ERROR: Input data is corrupted");
          break;
        default:
          goto switchD_0026e256_caseD_fffffffe;
        }
      } while (iVar22 == -5);
    }
    else if (uVar20 == 0) {
      QByteArray::truncate(&local_168,(char *)(long)(int)uVar9,__length);
      qVar19 = local_168.d.size;
      pcVar25 = local_168.d.ptr;
      pDVar7 = local_168.d.d;
      local_168.d.d = (Data *)0x0;
      local_168.d.ptr = (char *)0x0;
      (__return_storage_ptr__->d).d = pDVar7;
      (__return_storage_ptr__->d).ptr = pcVar25;
      local_168.d.size = 0;
      (__return_storage_ptr__->d).size = qVar19;
    }
    else {
      local_148.context.version = 2;
      local_148.context.line = 0;
      local_148.context.file._0_4_ = 0;
      local_148.context.file._4_4_ = 0;
      local_148.context.function._0_4_ = 0;
      local_148.context.function._4_4_ = 0;
      local_148.context.category = "default";
      QMessageLogger::warning
                (&local_148,"QZip: Unsupported compression method %d is needed to extract the data."
                 ,uVar28);
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char *)0x0;
      (__return_storage_ptr__->d).size = 0;
    }
switchD_0026e256_caseD_fffffffe:
    if (&(local_168.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_168.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  else {
    local_148.context.version = 2;
    local_148.context.line = 0;
    local_148.context.file._0_4_ = 0;
    local_148.context.file._4_4_ = 0;
    local_148.context.function._0_4_ = 0;
    local_148.context.function._4_4_ = 0;
    local_148.context.category = "default";
    QMessageLogger::warning
              (&local_148,
               "QZip: .ZIP specification version %d implementationis needed to extract the data.");
LAB_0026e04c:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,1,0x10);
    }
  }
  if (pQStack_70 != (QArrayData *)0x0) {
    LOCK();
    (pQStack_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQStack_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQStack_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQStack_70,1,0x10);
    }
  }
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,1,0x10);
    }
  }
LAB_0026e0d5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QZipReader::fileData(const QString &fileName) const
{
    d->scanFiles();
    int i;
    for (i = 0; i < d->fileHeaders.size(); ++i) {
        if (QString::fromLocal8Bit(d->fileHeaders.at(i).file_name) == fileName)
            break;
    }
    if (i == d->fileHeaders.size())
        return QByteArray();

    FileHeader header = d->fileHeaders.at(i);

    ushort version_needed = readUShort(header.h.version_needed);
    if (version_needed > ZIP_VERSION) {
        qWarning("QZip: .ZIP specification version %d implementationis needed to extract the data.", version_needed);
        return QByteArray();
    }

    ushort general_purpose_bits = readUShort(header.h.general_purpose_bits);
    int compressed_size = readUInt(header.h.compressed_size);
    int uncompressed_size = readUInt(header.h.uncompressed_size);
    int start = readUInt(header.h.offset_local_header);
    //qDebug("uncompressing file %d: local header at %d", i, start);

    d->device->seek(start);
    LocalFileHeader lh;
    d->device->read((char *)&lh, sizeof(LocalFileHeader));
    uint skip = readUShort(lh.file_name_length) + readUShort(lh.extra_field_length);
    d->device->seek(d->device->pos() + skip);

    int compression_method = readUShort(lh.compression_method);
    //qDebug("file=%s: compressed_size=%d, uncompressed_size=%d", fileName.toLocal8Bit().data(), compressed_size, uncompressed_size);

    if ((general_purpose_bits & Encrypted) != 0) {
        qWarning("QZip: Unsupported encryption method is needed to extract the data.");
        return QByteArray();
    }

    //qDebug("file at %lld", d->device->pos());
    QByteArray compressed = d->device->read(compressed_size);
    if (compression_method == CompressionMethodStored) {
        // no compression
        compressed.truncate(uncompressed_size);
        return compressed;
    } else if (compression_method == CompressionMethodDeflated) {
        // Deflate
        //qDebug("compressed=%d", compressed.size());
        compressed.truncate(compressed_size);
        QByteArray baunzip;
        ulong len = qMax(uncompressed_size,  1);
        int res;
        do {
            baunzip.resize(len);
            res = inflate((uchar*)baunzip.data(), &len,
                          (const uchar*)compressed.constData(), compressed_size);

            switch (res) {
            case Z_OK:
                if ((int)len != baunzip.size())
                    baunzip.resize(len);
                break;
            case Z_MEM_ERROR:
                qWarning("QZip: Z_MEM_ERROR: Not enough memory");
                break;
            case Z_BUF_ERROR:
                len *= 2;
                break;
            case Z_DATA_ERROR:
                qWarning("QZip: Z_DATA_ERROR: Input data is corrupted");
                break;
            }
        } while (res == Z_BUF_ERROR);
        return baunzip;
    }

    qWarning("QZip: Unsupported compression method %d is needed to extract the data.", compression_method);
    return QByteArray();
}